

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::logic_t_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::logic_t_const&> *this,logic_t *rhs)

{
  int iVar1;
  int iVar2;
  logic_t *value;
  ostream *poVar3;
  ostringstream os;
  allocator<char> local_221;
  string local_220 [32];
  string local_200 [32];
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  value = *(logic_t **)this;
  iVar1 = rhs->value;
  iVar2 = value->value;
  std::__cxx11::string::string<std::allocator<char>>(local_220,"==",&local_221);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string<(anonymous_namespace)::logic_t>(&local_1c0,value);
  poVar3 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,local_220);
  poVar3 = std::operator<<(poVar3," ");
  to_string<(anonymous_namespace)::logic_t>(&local_1e0,rhs);
  std::operator<<(poVar3,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  __return_storage_ptr__->passed = iVar2 == iVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_220);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }